

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBox::setOptions(QMessageBox *this,Options options)

{
  long lVar1;
  QFlagsStorageHelper<QMessageBox::Option,_4> QVar2;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  QVar2.super_QFlagsStorage<QMessageBox::Option>.i =
       (QFlagsStorage<QMessageBox::Option>)QMessageBox::options(this);
  if (QVar2.super_QFlagsStorage<QMessageBox::Option>.i ==
      (QFlagsStorage<QMessageBox::Option>)
      options.super_QFlagsStorageHelper<QMessageBox::Option,_4>.
      super_QFlagsStorage<QMessageBox::Option>.i) {
    return;
  }
  QMessageDialogOptions::setOptions
            (*(undefined8 *)(lVar1 + 0x3a0),
             options.super_QFlagsStorageHelper<QMessageBox::Option,_4>.
             super_QFlagsStorage<QMessageBox::Option>.i);
  return;
}

Assistant:

void QMessageBox::setOptions(QMessageBox::Options options)
{
    Q_D(QMessageBox);

    if (QMessageBox::options() == options)
        return;

    d->options->setOptions(QMessageDialogOptions::Option(int(options)));
}